

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O2

RGBColor __thiscall pm::Matte::globalShade(Matte *this,ShadeRecord *sr)

{
  undefined8 uVar1;
  float fVar2;
  Vector3 *in_RDX;
  undefined8 extraout_XMM0_Qa;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  RGBColor RVar6;
  float pdf;
  RGBColor f;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined1 local_80 [8];
  float local_78;
  RGBColor local_70;
  undefined1 local_60 [16];
  Vector3 local_50;
  float local_40;
  float fStack_3c;
  float local_38;
  
  (this->super_Material)._vptr_Material = (_func_int **)0x0;
  (this->super_Material).type_ = MATTE;
  if (in_RDX[6].y == 0.0) {
    (**(code **)(*(long *)sr + 0x18))(&local_98,sr);
    (this->super_Material)._vptr_Material = (_func_int **)CONCAT44(fStack_94,local_98);
    (this->super_Material).type_ = (Type)fStack_90;
  }
  local_40 = 0.0;
  fStack_3c = 0.0;
  local_38 = 0.0;
  local_50.z = -in_RDX[6].x;
  local_50.x = in_RDX[5].y;
  local_50.y = in_RDX[5].z;
  local_50._0_8_ = local_50._0_8_ ^ 0x8000000080000000;
  Lambertian::sampleF((Lambertian *)local_60,(ShadeRecord *)&(sr->ray).d,in_RDX,&local_50,&local_40)
  ;
  fVar2 = local_38;
  local_88 = CONCAT44(local_38,fStack_3c);
  local_98 = in_RDX[1].y;
  fStack_94 = in_RDX[1].z;
  fStack_90 = in_RDX[2].x;
  fStack_8c = local_40;
  fVar5 = local_38 * in_RDX[4].x + in_RDX[3].y * local_40 + in_RDX[3].z * fStack_3c;
  uVar1._0_4_ = in_RDX[8].x;
  uVar1._4_4_ = in_RDX[8].y;
  (**(code **)(**(long **)&in_RDX[8].z + 0x18))
            (local_80,*(long **)&in_RDX[8].z,uVar1,&local_98,(int)in_RDX[6].y + 1);
  fVar3 = 0.0;
  local_70.b = ((float)local_60._8_4_ * local_78 * fVar5) / 0.0;
  auVar4._0_4_ = fVar5 * local_80._0_4_ * (float)local_60._0_8_;
  auVar4._4_4_ = fVar5 * local_80._4_4_ * SUB84(local_60._0_8_,4);
  auVar4._8_4_ = fVar2 * 0.0;
  auVar4._12_4_ = fVar2 * 0.0;
  auVar4 = divps(auVar4,ZEXT816(0));
  local_70._0_8_ = auVar4._0_8_;
  RGBColor::operator+=((RGBColor *)this,&local_70);
  RVar6.b = fVar3;
  RVar6.r = (float)(int)extraout_XMM0_Qa;
  RVar6.g = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return RVar6;
}

Assistant:

RGBColor Matte::globalShade(ShadeRecord &sr) const
{
	RGBColor L;

	if (sr.depth == 0)
		L = areaLightShade(sr);

	Vector3 wi;
	const Vector3 wo = -sr.ray.d;
	float pdf = 0.0f;
	const RGBColor f = diffuseBrdf_.sampleF(sr, wo, wi, pdf);
	const float nDotWi = dot(sr.normal, wi);
	const Ray reflectedRay(sr.hitPoint, wi);

	L += f * sr.tracer.traceRay(sr.world, reflectedRay, sr.depth + 1) * nDotWi / pdf;

	return L;
}